

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint8_t * svb_decode_avx_simple(uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count)

{
  byte bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  uint8_t *puVar6;
  byte bVar8;
  ulong uVar7;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (0x1f < count) {
    uVar9 = 1;
    out = out + 0x20;
    uVar7 = *(ulong *)keyPtr;
    while( true ) {
      bVar8 = (byte)(uVar7 >> 8);
      if (count >> 5 == uVar9) break;
      uVar2 = *(ulong *)(keyPtr + uVar9 * 8);
      uVar9 = uVar9 + 1;
      uVar11 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar7 & 0xff];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                           *(undefined1 (*) [16])
                            (shuffleTable[0] + (uint)((int)(uVar7 & 0xff) << 4)));
      *(undefined1 (*) [16])(out + -0x20) = auVar3;
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar8];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar11),
                           (undefined1  [16])shuffleTable[bVar8]);
      lVar4 = bVar1 + uVar11;
      *(undefined1 (*) [16])(out + -0x1c) = auVar3;
      uVar10 = (uint)uVar7 >> 0x10 & 0xff;
      bVar8 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar10];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + bVar1 + uVar11),
                           *(undefined1 (*) [16])(shuffleTable[0] + (uVar10 << 4)));
      lVar5 = (ulong)bVar8 + lVar4;
      *(undefined1 (*) [16])(out + -0x18) = auVar3;
      uVar11 = uVar7 >> 0x18 & 0xff;
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar11];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])dataPtr + (ulong)bVar8 + lVar4),
                           *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      lVar4 = (ulong)bVar1 + lVar5;
      *(undefined1 (*) [16])(out + -0x14) = auVar3;
      uVar11 = uVar7 >> 0x20 & 0xff;
      bVar8 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar11];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar5),
                           *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      lVar5 = (ulong)bVar8 + lVar4;
      *(undefined1 (*) [16])(out + -0x10) = auVar3;
      uVar11 = uVar7 >> 0x28 & 0xff;
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar11];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])dataPtr + (ulong)bVar8 + lVar4),
                           *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      uVar11 = uVar7 >> 0x30 & 0xff;
      lVar4 = (ulong)bVar1 + lVar5;
      *(undefined1 (*) [16])(out + -0xc) = auVar3;
      bVar8 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar11];
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar5),
                           *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      *(undefined1 (*) [16])(out + -8) = auVar3;
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])dataPtr + (ulong)bVar8 + lVar4),
                           (undefined1  [16])shuffleTable[uVar7 >> 0x38]);
      dataPtr = *(undefined1 (*) [16])dataPtr +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar7 >> 0x38] + (ulong)bVar8 + lVar4;
      *(undefined1 (*) [16])(out + -4) = auVar3;
      out = out + 0x20;
      uVar7 = uVar2;
    }
    uVar9 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                   [uVar7 & 0xff];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)(uVar7 & 0xff) << 4)))
    ;
    *(undefined1 (*) [16])(out + -0x20) = auVar3;
    bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [bVar8];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar9),
                         (undefined1  [16])shuffleTable[bVar8]);
    uVar10 = (uint)uVar7 >> 0x10 & 0xff;
    lVar4 = bVar1 + uVar9;
    *(undefined1 (*) [16])(out + -0x1c) = auVar3;
    bVar8 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar10];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + bVar1 + uVar9),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uVar10 << 4)));
    uVar9 = uVar7 >> 0x18 & 0xff;
    lVar5 = (ulong)bVar8 + lVar4;
    *(undefined1 (*) [16])(out + -0x18) = auVar3;
    bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar9];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar8 + lVar4),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
    uVar9 = uVar7 >> 0x20 & 0xff;
    lVar4 = (ulong)bVar1 + lVar5;
    *(undefined1 (*) [16])(out + -0x14) = auVar3;
    bVar8 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar9];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar5),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
    uVar9 = uVar7 >> 0x28 & 0xff;
    lVar5 = (ulong)bVar8 + lVar4;
    *(undefined1 (*) [16])(out + -0x10) = auVar3;
    bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar9];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar8 + lVar4),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
    uVar9 = uVar7 >> 0x30 & 0xff;
    lVar4 = (ulong)bVar1 + lVar5;
    *(undefined1 (*) [16])(out + -0xc) = auVar3;
    bVar8 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar9];
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar5),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
    *(undefined1 (*) [16])(out + -8) = auVar3;
    auVar3 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar8 + lVar4),
                         (undefined1  [16])shuffleTable[uVar7 >> 0x38]);
    dataPtr = *(undefined1 (*) [16])dataPtr +
              (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar7 >> 0x38] + (ulong)bVar8 + lVar4;
    *(undefined1 (*) [16])(out + -4) = auVar3;
  }
  puVar6 = svb_decode_scalar(out,keyPtr + (count >> 5) * 8,dataPtr,(uint)count & 0x1f);
  return puVar6;
}

Assistant:

uint8_t *svb_decode_avx_simple(uint32_t *out, uint8_t *__restrict__ keyPtr,
                               uint8_t *__restrict__ dataPtr, uint64_t count) {

  uint64_t keybytes = count / 4; // number of key bytes
  xmm_t Data;
  if (keybytes >= 8) {

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];

      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 4, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 8, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 12, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 16, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 20, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 24, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 28, Data);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;

      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 4, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 8, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 12, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 16, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 20, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 24, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 28, Data);

      out += 32;
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar(out, keyPtr + consumedkeys, dataPtr, count & 31);
}